

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

void __thiscall ui::Led::Toggle(Led *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_ofstream<char,_std::char_traits<char>_> local_440 [528];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_ofstream<char,_std::char_traits<char>_> local_210 [512];
  Led *local_10;
  Led *this_local;
  
  this->brightness_ = (uint)(this->brightness_ == 0);
  local_10 = this;
  std::operator+(&local_230,&this->file_path_,"/brightness");
  std::ofstream::ofstream(local_210,(string *)&local_230,_S_out);
  std::operator<<(local_210,&this->brightness_);
  std::ofstream::~ofstream(local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::operator+(&local_460,&this->file_path_,"/trigger");
  std::ofstream::ofstream(local_440,(string *)&local_460,_S_out);
  std::operator<<(local_440,(char (*) [5])"none");
  std::ofstream::~ofstream(local_440);
  std::__cxx11::string::~string((string *)&local_460);
  FetchState(this);
  return;
}

Assistant:

void Toggle() {
    brightness_ = !brightness_;
    std::ofstream(file_path_ + "/brightness") << brightness_;
    std::ofstream(file_path_ + "/trigger") << "none";
    FetchState();
  }